

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O3

int Sat_MemCompactLearned(Sat_Mem_t *p,int fDoMove)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *__src;
  uint uVar10;
  long lVar11;
  int **ppiVar12;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  iVar1 = p->iPage[1];
  uVar9 = (ulong)iVar1;
  uVar4 = p->nPageSize;
  ppiVar12 = p->pPages;
  uVar6 = iVar1 << ((byte)uVar4 & 0x1f) | *ppiVar12[uVar9];
  uVar10 = 1 << (uVar4 & 0x1f) | 2;
  if (uVar6 == uVar10) {
    return 0;
  }
  uVar3 = 0;
  if ((fDoMove == 0) || (uVar15 = p->BookMarkH[1], uVar15 == 0)) {
LAB_008ee234:
    puVar13 = (uint *)0x0;
  }
  else {
    if (((int)uVar15 < (int)uVar10) || ((int)uVar6 < (int)uVar15)) {
      __assert_fail("p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                    ,0x179,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
    }
    uVar10 = p->uPageMask & uVar15;
    if (uVar10 == 0) goto LAB_008ee531;
    puVar13 = (uint *)(ppiVar12[(int)uVar15 >> ((byte)uVar4 & 0x1f)] + (int)uVar10);
    if (((int)uVar15 < (int)uVar6) && ((*puVar13 & 2) == 0)) {
      p->BookMarkH[1] = puVar13[(ulong)(*puVar13 >> 0xb) + 1];
      goto LAB_008ee234;
    }
  }
  if (iVar1 < 1) {
    uVar10 = 2;
    uVar6 = 1;
  }
  else {
    uVar6 = 1;
    uVar10 = 2;
    uVar3 = 0;
    uVar14 = 1;
    bVar2 = false;
    do {
      piVar5 = ppiVar12[uVar14];
      if (2 < *piVar5) {
        uVar9 = 2;
        do {
          uVar15 = piVar5[uVar9];
          if ((uVar15 & 1) == 0) {
            __assert_fail("c->lrn",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x187,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
          }
          __src = (uint *)(piVar5 + uVar9);
          if ((uVar15 & 2) == 0) {
            if (bVar2) {
              p->BookMarkH[1] = __src[(ulong)(uVar15 >> 0xb) + 1];
              uVar15 = *__src;
              uVar7 = uVar15 & 1;
            }
            else {
              uVar7 = 1;
            }
            uVar7 = (uVar15 >> 0xb) + uVar7 + 2 & 0xfffffffe;
            if (1 << ((byte)uVar4 & 0x1f) <= (int)(uVar7 + uVar10)) {
              if (fDoMove != 0) {
                *ppiVar12[(int)uVar6] = uVar10;
              }
              uVar6 = uVar6 + 2;
              uVar10 = 2;
            }
            lVar11 = (long)(int)uVar6;
            if (fDoMove == 0) {
              uVar15 = *__src;
              __src[(ulong)(uVar15 >> 0xb) + 1] = uVar6 << ((byte)p->nPageSize & 0x1f) | uVar10;
            }
            else {
              uVar15 = *__src;
              uVar8 = (ulong)(uVar15 >> 0xb);
              if (__src[uVar8 + 1] != (uVar6 << ((byte)p->nPageSize & 0x1f) | uVar10)) {
                __assert_fail("c->lits[c->size] == Sat_MemHand(p, iNew, kNew)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                              ,0x1a9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
              }
              if ((uVar14 != uVar6) || ((uint)uVar9 != uVar10)) {
                memmove(ppiVar12[lVar11] + (int)uVar10,__src,(ulong)(uVar7 * 4));
                ppiVar12 = p->pPages;
                uVar15 = ppiVar12[lVar11][(int)uVar10];
                uVar8 = (ulong)(uVar15 >> 0xb);
                if (uVar7 != ((uVar15 & 1) + (uVar15 >> 0xb) + 2 & 0xfffffffe)) {
                  __assert_fail("nInts == Sat_MemClauseSize(c)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                                ,0x1b0,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
                }
                __src = (uint *)(ppiVar12[lVar11] + (int)uVar10);
              }
              __src[uVar8 + 1] = uVar3;
            }
            if ((long)uVar14 < lVar11) {
LAB_008ee4b5:
              __assert_fail("iNew <= i && kNew < (1 << p->nPageSize)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                            ,0x1b9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
            }
            uVar10 = uVar10 + uVar7;
            uVar4 = p->nPageSize;
            if (1 << ((byte)uVar4 & 0x1f) <= (int)uVar10) goto LAB_008ee4b5;
            uVar3 = uVar3 + 1;
            uVar7 = uVar15 & 1;
            bVar2 = false;
          }
          else if (puVar13 == (uint *)0x0) {
            uVar7 = 1;
            puVar13 = (uint *)0x0;
          }
          else {
            bVar16 = puVar13 == __src;
            if (bVar16) {
              puVar13 = (uint *)0x0;
            }
            uVar7 = 1;
            if (bVar16) {
              bVar2 = true;
            }
          }
          uVar15 = (uint)uVar9 + (uVar7 + (uVar15 >> 0xb) + 2 & 0xfffffffe);
          uVar9 = (ulong)uVar15;
          piVar5 = ppiVar12[uVar14];
        } while ((int)uVar15 < *piVar5);
        uVar9 = (ulong)(uint)p->iPage[1];
      }
      uVar14 = uVar14 + 2;
    } while ((int)uVar14 <= (int)uVar9);
  }
  if (fDoMove != 0) {
    p->nEntries[1] = uVar3;
    p->iPage[1] = uVar6;
    *ppiVar12[(int)uVar6] = uVar10;
    uVar4 = p->BookMarkH[1];
    if (uVar4 != 0) {
      if (puVar13 == (uint *)0x0) {
        uVar6 = p->uPageMask & uVar4;
        if (uVar6 == 0) {
LAB_008ee531:
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                        ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
        }
        piVar5 = ppiVar12[(int)uVar4 >> ((byte)p->nPageSize & 0x1f)] + (int)uVar6 +
                 (ulong)((uint)ppiVar12[(int)uVar4 >> ((byte)p->nPageSize & 0x1f)][(int)uVar6] >>
                        0xb) + 1;
      }
      else {
        piVar5 = p->nEntries + 1;
        p->BookMarkH[1] = p->iPage[1] << ((byte)p->nPageSize & 0x1f) | *ppiVar12[p->iPage[1]];
      }
      p->BookMarkE[1] = *piVar5;
    }
  }
  return uVar3;
}

Assistant:

static inline int Sat_MemCompactLearned( Sat_Mem_t * p, int fDoMove )
{
    clause * c, * cPivot = NULL;
    int i, k, iNew = 1, kNew = 2, nInts, fStartLooking, Counter = 0;
    int hLimit = Sat_MemHandCurrent(p, 1);
    if ( hLimit == Sat_MemHand(p, 1, 2) )
        return 0;
    if ( fDoMove && p->BookMarkH[1] )
    {
        // move the pivot
        assert( p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit );
        // get the pivot and remember it may be pointed offlimit
        cPivot = Sat_MemClauseHand( p, p->BookMarkH[1] );
        if ( p->BookMarkH[1] < hLimit && !cPivot->mark )
        {
            p->BookMarkH[1] = cPivot->lits[cPivot->size];
            cPivot = NULL;
        }
        // else find the next used clause after cPivot
    }
    // iterate through the learned clauses
    fStartLooking = 0;
    Sat_MemForEachLearned( p, c, i, k )
    {
        assert( c->lrn );
        // skip marked entry
        if ( c->mark )
        {
            // if pivot is a marked clause, start looking for the next non-marked one
            if ( cPivot && cPivot == c )
            {
                fStartLooking = 1;
                cPivot = NULL;
            }
            continue;
        }
        // if we started looking before, we found it!
        if ( fStartLooking )
        {
            fStartLooking = 0;
            p->BookMarkH[1] = c->lits[c->size];
        }
        // compute entry size
        nInts = Sat_MemClauseSize(c);
        assert( !(nInts & 1) );
        // check if we need to scroll to the next page
        if ( kNew + nInts >= (1 << p->nPageSize) )
        {
            // set the limit of the current page
            if ( fDoMove )
                Sat_MemWriteLimit( p->pPages[iNew], kNew );
            // move writing position to the new page
            iNew += 2;
            kNew = 2;
        }
        if ( fDoMove )
        {
            // make sure the result is the same as previous dry run
            assert( c->lits[c->size] == Sat_MemHand(p, iNew, kNew) );
            // only copy the clause if it has changed
            if ( i != iNew || k != kNew )
            {
                memmove( p->pPages[iNew] + kNew, c, sizeof(int) * nInts );
//                c = Sat_MemClause( p, iNew, kNew ); // assersions do not hold during dry run
                c = (clause *)(p->pPages[iNew] + kNew);
                assert( nInts == Sat_MemClauseSize(c) );
            }
            // set the new ID value
            c->lits[c->size] = Counter;
        }
        else // remember the address of the clause in the new location
            c->lits[c->size] = Sat_MemHand(p, iNew, kNew);
        // update writing position
        kNew += nInts;
        assert( iNew <= i && kNew < (1 << p->nPageSize) );
        // update counter
        Counter++;
    }
    if ( fDoMove )
    {
        // update the counter
        p->nEntries[1] = Counter;
        // update the page count
        p->iPage[1] = iNew;
        // set the limit of the last page
        Sat_MemWriteLimit( p->pPages[iNew], kNew );
        // check if the pivot need to be updated
        if ( p->BookMarkH[1] )
        {
            if ( cPivot )
            {
                p->BookMarkH[1] = Sat_MemHandCurrent(p, 1);
                p->BookMarkE[1] = p->nEntries[1];
            }
            else
                p->BookMarkE[1] = clause_id(Sat_MemClauseHand( p, p->BookMarkH[1] ));
        }

    }
    return Counter;
}